

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O3

Window get_glx_window(Display *dpy,XVisualInfo *visinfo,_Bool map)

{
  undefined8 uVar1;
  Window WVar2;
  XSetWindowAttributes window_attr;
  
  uVar1 = *(undefined8 *)(*(long *)(dpy + 0xe8) + 0x10 + (long)*(int *)(dpy + 0xe0) * 0x80);
  window_attr.background_pixel = 0;
  window_attr.border_pixel = 0;
  window_attr.colormap = XCreateColormap(dpy,uVar1,visinfo->visual,0);
  window_attr.event_mask = 0x28001;
  WVar2 = XCreateWindow(dpy,uVar1,0,0,10,10,0,visinfo->depth,1,visinfo->visual,0x280a,&window_attr);
  return WVar2;
}

Assistant:

Window
get_glx_window(Display *dpy, XVisualInfo *visinfo, bool map)
{
	XSetWindowAttributes window_attr;
	unsigned long mask;
	int screen = DefaultScreen(dpy);
	Window root_win = RootWindow(dpy, screen);
	Window win;

        EPOXY_UNUSED(map);

	window_attr.background_pixel = 0;
	window_attr.border_pixel = 0;
	window_attr.colormap = XCreateColormap(dpy, root_win,
					       visinfo->visual, AllocNone);
	window_attr.event_mask = StructureNotifyMask | ExposureMask |
		KeyPressMask;
	mask = CWBackPixel | CWBorderPixel | CWColormap | CWEventMask;
	win = XCreateWindow(dpy, root_win, 0, 0,
			    10, 10, /* width, height */
			    0, visinfo->depth, InputOutput,
			    visinfo->visual, mask, &window_attr);

	return win;
}